

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionDiscrete.cpp
# Opt level: O2

void __thiscall
JointActionDiscrete::JointActionDiscrete(JointActionDiscrete *this,JointActionDiscrete *o)

{
  pointer ppAVar1;
  ActionDiscrete *in_RAX;
  pointer ppAVar2;
  ActionDiscrete *t;
  ActionDiscrete *local_38;
  
  (this->super_DiscreteEntity)._m_index = (o->super_DiscreteEntity)._m_index;
  (this->super_JointAction)._vptr_JointAction = (_func_int **)&PTR__JointActionDiscrete_006069e0;
  (this->super_DiscreteEntity)._vptr_DiscreteEntity =
       (_func_int **)&PTR__JointActionDiscrete_00606a28;
  (this->_m_aIndexVector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_aIndexVector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_aIndexVector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_apVector).
  super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_aIndexVector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_apVector).
  super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_apVector).
  super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_apVector).
  super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppAVar1 = (o->_m_apVector).
            super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_38 = in_RAX;
  for (ppAVar2 = (o->_m_apVector).
                 super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppAVar2 != ppAVar1;
      ppAVar2 = ppAVar2 + 1) {
    local_38 = *ppAVar2;
    std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>::push_back
              (&this->_m_apVector,&local_38);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->_m_aIndexVector,&o->_m_aIndexVector);
  return;
}

Assistant:

JointActionDiscrete::JointActionDiscrete(const JointActionDiscrete& o) :
    DiscreteEntity(o)
{    
if(DEBUG_JAD)   cout << " cloning joint action ";

    vector<const ActionDiscrete*>::const_iterator itp = o._m_apVector.begin();
    vector<const ActionDiscrete*>::const_iterator lastp = o._m_apVector.end();
    while(itp != lastp)
    {
        const ActionDiscrete* t = *itp;
        _m_apVector.push_back(t);
        itp++;
    }
    _m_aIndexVector = o._m_aIndexVector;
}